

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void bc_trie_foreach_node
               (bc_trie_node_t *node,bc_string_t *str,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *str_00;
  
  if (str != (bc_string_t *)0x0) {
    do {
      if (node == (bc_trie_node_t *)0x0) {
        return;
      }
      if (node->key == '\0') {
        (*func)(str->str,node->data,user_data);
      }
      if (node->child != (_bc_trie_node_t *)0x0) {
        str_00 = bc_string_dup(str);
        bc_string_append_c(str_00,node->key);
        bc_trie_foreach_node(node->child,str_00,func,user_data);
        if (str_00 != (bc_string_t *)0x0) {
          free(str_00->str);
          free(str_00);
        }
      }
      node = node->next;
    } while (node != (_bc_trie_node_t *)0x0);
  }
  return;
}

Assistant:

static void
bc_trie_foreach_node(bc_trie_node_t *node, bc_string_t *str,
    bc_trie_foreach_func_t func, void *user_data)
{
    if (node == NULL || str == NULL || func == NULL)
        return;

    if (node->key == '\0')
        func(str->str, node->data, user_data);

    if (node->child != NULL) {
        bc_string_t *child = bc_string_dup(str);
        child = bc_string_append_c(child, node->key);
        bc_trie_foreach_node(node->child, child, func, user_data);
        bc_string_free(child, true);
    }

    if (node->next != NULL)
        bc_trie_foreach_node(node->next, str, func, user_data);
}